

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImRect __thiscall ImGuiWindow::MenuBarRect(ImGuiWindow *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float y1;
  ImGuiWindow *this_local;
  
  fVar3 = (this->Pos).y;
  fVar2 = TitleBarHeight(this);
  fVar3 = fVar3 + fVar2;
  fVar2 = (this->Pos).x;
  fVar1 = (this->SizeFull).x;
  fVar4 = MenuBarHeight(this);
  ImRect::ImRect((ImRect *)&this_local,fVar2,fVar3,fVar2 + fVar1,fVar3 + fVar4);
  return _this_local;
}

Assistant:

ImRect      MenuBarRect() const                     { float y1 = Pos.y + TitleBarHeight(); return ImRect(Pos.x, y1, Pos.x + SizeFull.x, y1 + MenuBarHeight()); }